

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
::select_variables(solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int unaff_R15D;
  double dVar9;
  
  iVar6 = sizes->c_size;
  iVar4 = iVar6 + bkmin;
  if (bkmin == bkmax) {
    if (sizes->r_size < iVar4) {
      iVar4 = sizes->r_size;
    }
    iVar6 = iVar4 + -1;
  }
  else {
    iVar5 = bkmax + iVar6;
    if (sizes->r_size < bkmax + iVar6) {
      iVar5 = sizes->r_size;
    }
    bVar2 = iVar5 < iVar4;
    if (iVar4 <= iVar5) {
      unaff_R15D = iVar6 + -1 + bkmin;
      lVar8 = ((long)bkmin + (long)iVar6) * 0xc;
      lVar7 = (long)bkmin + (long)iVar6;
      do {
        fVar1 = *(float *)((long)&((this->R)._M_t.
                                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                                   .
                                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
                                  ._M_head_impl)->value + lVar8);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          bVar3 = fVar1 < 0.0;
        }
        else {
          dVar9 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar3 = dVar9 < 0.5;
        }
        if (bVar3) break;
        bVar2 = iVar5 <= lVar7;
        unaff_R15D = unaff_R15D + 1;
        lVar8 = lVar8 + 0xc;
        lVar7 = lVar7 + 1;
      } while (iVar5 != unaff_R15D);
    }
    iVar6 = iVar5 + -1;
    if (!bVar2) {
      iVar6 = unaff_R15D;
    }
  }
  return iVar6;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }